

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel3
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  iterator iVar1;
  bool bVar2;
  iterator iVar3;
  static_string_view keyword;
  CurrentAndNextIter args;
  
  iVar1._M_node =
       (newArgs->super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    iVar3._M_node = iVar1._M_node;
    if (iVar1._M_node != (_List_node_base *)newArgs) {
      iVar3._M_node =
           (((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &(iVar1._M_node)->_M_next)->
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           _M_impl._M_node.super__List_node_base._M_next;
    }
    if (iVar3._M_node == (_List_node_base *)newArgs) break;
    keyword.super_string_view._M_str = DAT_008cf208;
    keyword.super_string_view._M_len = (anonymous_namespace)::keyNOT;
    bVar2 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(iVar1._M_node + 1));
    if (bVar2) {
      bVar2 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)(iVar3._M_node + 1),errorString,status,
                         false);
      args.next._M_node = iVar3._M_node;
      args.current._M_node = iVar1._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,!bVar2,args);
    }
    iVar1._M_node = (iVar1._M_node)->_M_next;
  }
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel3(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make2ArgsIterator(); args.next != newArgs.end();
       args.advance(newArgs)) {
    if (this->IsKeyword(keyNOT, *args.current)) {
      const auto rhs = this->GetBooleanValueWithAutoDereference(
        *args.next, errorString, status);
      newArgs.ReduceOneArg(!rhs, args);
    }
  }
  return true;
}